

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void hideCursor(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if (((window->x11).cursorGrabbed != '\0') && (window->monitor == (_GLFWmonitor *)0x0)) {
    XUngrabPointer(_glfw.x11.display,0);
    (window->x11).cursorGrabbed = '\0';
  }
  if ((window->x11).cursorHidden == '\0') {
    XDefineCursor(_glfw.x11.display,(window->x11).handle,_glfw.x11.cursor);
    (window->x11).cursorHidden = '\x01';
  }
  return;
}

Assistant:

static void hideCursor(_GLFWwindow* window)
{
    // Un-grab cursor (in windowed mode only; in fullscreen mode we still
    // want the cursor grabbed in order to confine the cursor to the window
    // area)
    if (window->x11.cursorGrabbed && window->monitor == NULL)
    {
        XUngrabPointer(_glfw.x11.display, CurrentTime);
        window->x11.cursorGrabbed = GL_FALSE;
    }

    if (!window->x11.cursorHidden)
    {
        XDefineCursor(_glfw.x11.display, window->x11.handle, _glfw.x11.cursor);
        window->x11.cursorHidden = GL_TRUE;
    }
}